

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t do_helper_oc(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src,uintptr_t ra
                     )

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int size;
  byte bVar4;
  S390Access local_a8;
  S390Access local_80;
  S390Access local_58;
  
  iVar3 = cpu_mmu_index(env,SUB41(l,0));
  size = l + 1;
  access_prepare(&local_58,env,src,size,MMU_DATA_LOAD,iVar3,ra);
  access_prepare(&local_80,env,dest,size,MMU_DATA_LOAD,iVar3,ra);
  access_prepare(&local_a8,env,dest,size,MMU_DATA_STORE,iVar3,ra);
  bVar4 = 0;
  for (iVar3 = 0; size != iVar3; iVar3 = iVar3 + 1) {
    bVar1 = access_get_byte(env,&local_58,iVar3,ra);
    bVar2 = access_get_byte(env,&local_80,iVar3,ra);
    bVar4 = bVar4 | bVar2 | bVar1;
    access_set_byte(env,&local_a8,iVar3,bVar2 | bVar1,ra);
  }
  return (uint32_t)(bVar4 != 0);
}

Assistant:

static uint32_t do_helper_oc(CPUS390XState *env, uint32_t l, uint64_t dest,
                             uint64_t src, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca1, srca2, desta;
    uint32_t i;
    uint8_t c = 0;

    HELPER_LOG("%s l %d dest %" PRIx64 " src %" PRIx64 "\n",
               __func__, l, dest, src);

    /* OC always processes one more byte than specified - maximum is 256 */
    l++;

    srca1 = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    srca2 = access_prepare(env, dest, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < l; i++) {
        const uint8_t x = access_get_byte(env, &srca1, i, ra) |
                          access_get_byte(env, &srca2, i, ra);

        c |= x;
        access_set_byte(env, &desta, i, x, ra);
    }
    return c != 0;
}